

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_PEMX509Info_Test::TestBody(X509Test_PEMX509Info_Test *this)

{
  _Alloc_hider _Var1;
  ExpectedInfo *pEVar2;
  BIO *pBVar3;
  stack_st_X509_INFO *psVar4;
  X509_INFO *info;
  X509_INFO *info_00;
  X509_INFO *info_01;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar5;
  char *pcVar6;
  char *in_R9;
  bool bVar7;
  AssertionResult gtest_ar__4;
  string bad_pem;
  AssertionResult gtest_ar__7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  UniquePtr<X509_CRL> crl_obj;
  UniquePtr<EVP_PKEY> rsa_obj;
  UniquePtr<X509> cert_obj;
  UniquePtr<struct_stack_st_X509_INFO> infos2;
  UniquePtr<struct_stack_st_X509_INFO> infos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string invalid;
  string unknown;
  UniquePtr<EVP_PKEY> placeholder_key;
  string crl;
  UniquePtr<BIO> bio;
  string rsa;
  string encrypted_key;
  string cert;
  string pem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_168;
  tuple<X509_crl_st_*,_bssl::internal::Deleter> local_160;
  tuple<x509_st_*,_bssl::internal::Deleter> local_158;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_150;
  tuple<X509_crl_st_*,_bssl::internal::Deleter> local_148;
  tuple<x509_st_*,_bssl::internal::Deleter> local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  tuple<x509_st_*,_bssl::internal::Deleter> local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  tuple<x509_st_*,_bssl::internal::Deleter> local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  tuple<x509_st_*,_bssl::internal::Deleter> local_f8;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_90;
  tuple<X509_crl_st_*,_bssl::internal::Deleter> local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  tuple<X509_crl_st_*,_bssl::internal::Deleter> local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  tuple<X509_crl_st_*,_bssl::internal::Deleter> local_58;
  tuple<x509_st_*,_bssl::internal::Deleter> local_50;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_48;
  tuple<X509_crl_st_*,_bssl::internal::Deleter> local_40;
  undefined8 local_38;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> local_30;
  undefined8 local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cert,
             "\n-----BEGIN CERTIFICATE-----\nMIICVTCCAb6gAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwLjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxEDAOBgNVBAMTB1Jvb3QgQ0EwIBcNMTUwMTAx\nMDAwMDAwWhgPMjEwMDAxMDEwMDAwMDBaMC4xGjAYBgNVBAoTEUJvcmluZ1NTTCBU\nRVNUSU5HMRAwDgYDVQQDEwdSb290IENBMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCB\niQKBgQDpDn8RDOZa5oaDcPZRBy4CeBH1siSSOO4mYgLHlPE+oXdqwI/VImi2XeJM\n2uCFETXCknJJjYG0iJdrt/yyRFvZTQZw+QzGj+mz36NqhGxDWb6dstB2m8PX+plZ\nw7jl81MDvUnWs8yiQ/6twgu5AbhWKZQDJKcNKCEpqa6UW0r5nwIDAQABo3oweDAO\nBgNVHQ8BAf8EBAMCAgQwHQYDVR0lBBYwFAYIKwYBBQUHAwEGCCsGAQUFBwMCMA8G\nA1UdEwEB/wQFMAMBAf8wGQYDVR0OBBIEEEA31wH7QC+4HH5UBCeMWQEwGwYDVR0j\nBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkqhkiG9w0BAQsFAAOBgQDXylEK77Za\nkKeY6ZerrScWyZhrjIGtHFu09qVpdJEzrk87k2G7iHHR9CAvSofCgEExKtWNS9dN\n+9WiZp/U48iHLk7qaYXdEuO07No4BYtXn+lkOykE+FUxmA4wvOF1cTd2tdj3MzX2\nkfGIBAYhzGZWhY3JbhIfTEfY1PNM1pWChQ==\n-----END CERTIFICATE-----\n"
             ,(allocator<char> *)&local_188);
  CertFromPEM((anon_unknown_dwarf_862632 *)&cert_obj,
              "\n-----BEGIN CERTIFICATE-----\nMIICVTCCAb6gAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwLjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxEDAOBgNVBAMTB1Jvb3QgQ0EwIBcNMTUwMTAx\nMDAwMDAwWhgPMjEwMDAxMDEwMDAwMDBaMC4xGjAYBgNVBAoTEUJvcmluZ1NTTCBU\nRVNUSU5HMRAwDgYDVQQDEwdSb290IENBMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCB\niQKBgQDpDn8RDOZa5oaDcPZRBy4CeBH1siSSOO4mYgLHlPE+oXdqwI/VImi2XeJM\n2uCFETXCknJJjYG0iJdrt/yyRFvZTQZw+QzGj+mz36NqhGxDWb6dstB2m8PX+plZ\nw7jl81MDvUnWs8yiQ/6twgu5AbhWKZQDJKcNKCEpqa6UW0r5nwIDAQABo3oweDAO\nBgNVHQ8BAf8EBAMCAgQwHQYDVR0lBBYwFAYIKwYBBQUHAwEGCCsGAQUFBwMCMA8G\nA1UdEwEB/wQFMAMBAf8wGQYDVR0OBBIEEEA31wH7QC+4HH5UBCeMWQEwGwYDVR0j\nBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkqhkiG9w0BAQsFAAOBgQDXylEK77Za\nkKeY6ZerrScWyZhrjIGtHFu09qVpdJEzrk87k2G7iHHR9CAvSofCgEExKtWNS9dN\n+9WiZp/U48iHLk7qaYXdEuO07No4BYtXn+lkOykE+FUxmA4wvOF1cTd2tdj3MzX2\nkfGIBAYhzGZWhY3JbhIfTEfY1PNM1pWChQ==\n-----END CERTIFICATE-----\n"
             );
  rsa._M_string_length = 0;
  rsa._M_dataplus._M_p._0_1_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&crl);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)&rsa,(AssertionResult *)"cert_obj","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&unknown,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xba7,local_188._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&unknown,(Message *)&crl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unknown);
    std::__cxx11::string::~string((string *)&local_188);
    if ((long *)CONCAT71(crl._M_dataplus._M_p._1_7_,crl._M_dataplus._M_p._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(crl._M_dataplus._M_p._1_7_,crl._M_dataplus._M_p._0_1_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&rsa._M_string_length);
    goto LAB_00358eb3;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rsa._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rsa,(anonymous_namespace)::kRSAKey,(allocator<char> *)&local_188);
  PrivateKeyFromPEM((anon_unknown_dwarf_862632 *)&rsa_obj,(anonymous_namespace)::kRSAKey);
  crl._M_string_length = 0;
  crl._M_dataplus._M_p._0_1_ =
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
       rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&unknown);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)&crl,(AssertionResult *)"rsa_obj","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&invalid,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xbab,local_188._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&invalid,(Message *)&unknown);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&invalid);
    std::__cxx11::string::~string((string *)&local_188);
    if ((long *)CONCAT71(unknown._M_dataplus._M_p._1_7_,unknown._M_dataplus._M_p._0_1_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(unknown._M_dataplus._M_p._1_7_,unknown._M_dataplus._M_p._0_1_)
                  + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&crl._M_string_length);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&crl._M_string_length);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&crl,
               "\n-----BEGIN X509 CRL-----\nMIIBpzCBkAIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE\nCAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ\nQm9yaW5nU1NMFw0xNjA5MjYxNTEwNTVaFw0xNjEwMjYxNTEwNTVaoA4wDDAKBgNV\nHRQEAwIBATANBgkqhkiG9w0BAQsFAAOCAQEAnrBKKgvd9x9zwK9rtUvVeFeJ7+LN\nZEAc+a5oxpPNEsJx6hXoApYEbzXMxuWBQoCs5iEBycSGudct21L+MVf27M38KrWo\neOkq0a2siqViQZO2Fb/SUFR0k9zb8xl86Zf65lgPplALun0bV/HT7MJcl04Tc4os\ndsAReBs5nqTGNEd5AlC1iKHvQZkM//MD51DspKnDpsDiUVi54h9C1SpfZmX8H2Vv\ndiyu0fZ/bPAM3VAGawatf/SyWfBMyKpoPXEG39oAzmjjOj8en82psn7m474IGaho\n/vBbhl1ms5qQiLYPjm4YELtnXQoFyC72tBjbdFd/ZE9k4CNKDbxFUXFbkw==\n-----END X509 CRL-----\n"
               ,(allocator<char> *)&local_188);
    CRLFromPEM((anon_unknown_dwarf_862632 *)&crl_obj,
               "\n-----BEGIN X509 CRL-----\nMIIBpzCBkAIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE\nCAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ\nQm9yaW5nU1NMFw0xNjA5MjYxNTEwNTVaFw0xNjEwMjYxNTEwNTVaoA4wDDAKBgNV\nHRQEAwIBATANBgkqhkiG9w0BAQsFAAOCAQEAnrBKKgvd9x9zwK9rtUvVeFeJ7+LN\nZEAc+a5oxpPNEsJx6hXoApYEbzXMxuWBQoCs5iEBycSGudct21L+MVf27M38KrWo\neOkq0a2siqViQZO2Fb/SUFR0k9zb8xl86Zf65lgPplALun0bV/HT7MJcl04Tc4os\ndsAReBs5nqTGNEd5AlC1iKHvQZkM//MD51DspKnDpsDiUVi54h9C1SpfZmX8H2Vv\ndiyu0fZ/bPAM3VAGawatf/SyWfBMyKpoPXEG39oAzmjjOj8en82psn7m474IGaho\n/vBbhl1ms5qQiLYPjm4YELtnXQoFyC72tBjbdFd/ZE9k4CNKDbxFUXFbkw==\n-----END X509 CRL-----\n"
              );
    unknown._M_string_length = 0;
    unknown._M_dataplus._M_p._0_1_ =
         (__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)
         crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)
        crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&invalid);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&unknown,(AssertionResult *)"crl_obj","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&encrypted_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xbaf,local_188._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&encrypted_key,(Message *)&invalid)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&encrypted_key);
      std::__cxx11::string::~string((string *)&local_188);
      if (invalid._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)invalid._M_dataplus._M_p + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&unknown._M_string_length);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&unknown._M_string_length);
      placeholder_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)EVP_PKEY_new();
      unknown._M_string_length = 0;
      unknown._M_dataplus._M_p._0_1_ =
           (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
           placeholder_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0;
      if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
          placeholder_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&invalid);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_188,(internal *)&unknown,(AssertionResult *)"placeholder_key","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&encrypted_key,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xbb2,local_188._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&encrypted_key,(Message *)&invalid);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&encrypted_key);
        std::__cxx11::string::~string((string *)&local_188);
        if (invalid._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)invalid._M_dataplus._M_p + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&unknown._M_string_length);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&unknown._M_string_length);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&unknown,"-----BEGIN UNKNOWN-----\nAAAA\n-----END UNKNOWN-----\n",
                   (allocator<char> *)&local_188);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&invalid,
                   "-----BEGIN CERTIFICATE-----\nAAAA\n-----END CERTIFICATE-----\n",
                   (allocator<char> *)&local_188);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&encrypted_key,
                   "-----BEGIN EC PRIVATE KEY-----\nProc-Type: 4,ENCRYPTED\nDEK-Info: AES-128-CBC,B3B2988AECAE6EAB0D043105994C1123\n\nRK7DUIGDHWTFh2rpTX+dR88hUyC1PyDlIULiNCkuWFwHrJbc1gM6hMVOKmU196XC\niITrIKmilFm9CPD6Tpfk/NhI/QPxyJlk1geIkxpvUZ2FCeMuYI1To14oYOUKv14q\nwr6JtaX2G+pOmwcSPymZC4u2TncAP7KHgS8UGcMw8CE=\n-----END EC PRIVATE KEY-----\n"
                   ,(allocator<char> *)&local_188);
        std::operator+(&local_368,&cert,&rsa);
        std::operator+(&local_348,&local_368,&crl);
        std::operator+(&local_328,&local_348,&rsa);
        std::operator+(&local_308,&local_328,&crl);
        std::operator+(&local_2e8,&local_308,&cert);
        std::operator+(&local_2c8,&local_2e8,&crl);
        std::operator+(&local_2a8,&local_2c8,&unknown);
        std::operator+(&local_288,&local_2a8,&cert);
        std::operator+(&local_268,&local_288,&rsa);
        std::operator+(&local_248,&local_268,&cert);
        std::operator+(&local_228,&local_248,&cert);
        std::operator+(&local_208,&local_228,&cert);
        std::operator+(&local_1e8,&local_208,&cert);
        std::operator+(&local_1c8,&local_1e8,&rsa);
        std::operator+(&local_1a8,&local_1c8,&rsa);
        std::operator+(&local_490,&local_1a8,&rsa);
        std::operator+(&local_508,&local_490,&rsa);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infos2,
                       &local_508,&rsa);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infos,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infos2,
                       &crl);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bio,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infos,
                       &crl);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar__7,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bio,
                       &crl);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar__4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar__7,&crl);
        std::operator+(&bad_pem,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&gtest_ar__4,&cert);
        std::operator+(&local_188,&bad_pem,&encrypted_key);
        std::operator+(&pem,&local_188,&rsa);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&bad_pem);
        std::__cxx11::string::~string((string *)&gtest_ar__4);
        std::__cxx11::string::~string((string *)&gtest_ar__7);
        std::__cxx11::string::~string((string *)&bio);
        std::__cxx11::string::~string((string *)&infos);
        std::__cxx11::string::~string((string *)&infos2);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_368);
        local_188._M_dataplus._M_p =
             (pointer)cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_188._M_string_length =
             (size_type)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_188.field_2._M_allocated_capacity =
             (size_type)
             crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl;
        local_188.field_2._8_8_ =
             cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_168.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_160.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl;
        local_158.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_150.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_148.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl;
        local_140.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_138 = 0;
        uStack_130 = 0;
        local_128.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_120 = 0;
        uStack_118 = 0;
        local_110.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_108 = 0;
        uStack_100 = 0;
        local_f8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_f0.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_e8 = 0;
        uStack_e0 = 0;
        local_d8.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_d0 = 0;
        uStack_c8 = 0;
        local_c0.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_b8 = 0;
        uStack_b0 = 0;
        local_a8.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_a0 = 0;
        uStack_98 = 0;
        local_90.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_88.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl;
        local_80 = 0;
        uStack_78 = 0;
        local_70.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl;
        local_68 = 0;
        uStack_60 = 0;
        local_58.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl;
        local_50.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             cert_obj._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_48.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             placeholder_key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_40.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>)
             crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl;
        local_38 = 0;
        local_30.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)
             rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        local_28 = 0;
        bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
             BIO_new_mem_buf(pem._M_dataplus._M_p,(int)pem._M_string_length);
        gtest_ar__4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__4.success_ =
             (tuple<bio_st_*,_bssl::internal::Deleter>)
             bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_bio_st_*,_false>)0x0;
        if ((tuple<bio_st_*,_bssl::internal::Deleter>)
            bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_bio_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&gtest_ar__7);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&bad_pem,(internal *)&gtest_ar__4,(AssertionResult *)0x5104cb,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&infos,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xc0f,bad_pem._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&infos,(Message *)&gtest_ar__7)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&infos);
          std::__cxx11::string::~string((string *)&bad_pem);
          if (gtest_ar__7._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__7._0_8_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
          infos._M_t.super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl =
               (__uniq_ptr_data<stack_st_X509_INFO,_bssl::internal::Deleter,_true,_true>)
               PEM_X509_INFO_read_bio
                         ((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                          (stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__4.success_ =
               (tuple<stack_st_X509_INFO_*,_bssl::internal::Deleter>)
               infos._M_t.super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl !=
               (_Head_base<0UL,_stack_st_X509_INFO_*,_false>)0x0;
          if ((tuple<stack_st_X509_INFO_*,_bssl::internal::Deleter>)
              infos._M_t.super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl ==
              (_Head_base<0UL,_stack_st_X509_INFO_*,_false>)0x0) {
            testing::Message::Message((Message *)&gtest_ar__7);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&bad_pem,(internal *)&gtest_ar__4,(AssertionResult *)"infos","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&infos2,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xc12,bad_pem._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&infos2,(Message *)&gtest_ar__7);
LAB_00358aa8:
            puVar5 = &gtest_ar__4.message_;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&infos2);
            std::__cxx11::string::~string((string *)&bad_pem);
            if (gtest_ar__7._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__7._0_8_ + 8))();
            }
LAB_00358e1f:
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(puVar5);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__4.message_);
            gtest_ar__4.success_ = true;
            gtest_ar__4._1_7_ = 0;
            gtest_ar__7._0_8_ =
                 OPENSSL_sk_num((OPENSSL_STACK *)
                                infos._M_t.
                                super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl);
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&bad_pem,"(sizeof(kExpected) / sizeof((kExpected)[0]))",
                       "sk_X509_INFO_num(infos.get())",(unsigned_long *)&gtest_ar__4,
                       (unsigned_long *)&gtest_ar__7);
            if ((char)bad_pem._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&gtest_ar__4);
              if (bad_pem._M_string_length == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)bad_pem._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc13,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__4);
              goto LAB_00358dfe;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&bad_pem._M_string_length);
            for (bad_pem._M_dataplus._M_p = (pointer)0x0; bad_pem._M_dataplus._M_p < &DAT_0000000f;
                bad_pem._M_dataplus._M_p = bad_pem._M_dataplus._M_p + 1) {
              testing::ScopedTrace::ScopedTrace<unsigned_long>
                        ((ScopedTrace *)&gtest_ar__4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc15,(unsigned_long *)&bad_pem);
              _Var1._M_p = bad_pem._M_dataplus._M_p;
              pEVar2 = (ExpectedInfo *)
                       OPENSSL_sk_value((OPENSSL_STACK *)
                                        infos._M_t.
                                        super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>.
                                        _M_head_impl,(size_t)bad_pem._M_dataplus._M_p);
              TestBody::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(&local_188._M_dataplus + (long)_Var1._M_p * 3),
                         pEVar2,info);
              testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&gtest_ar__4);
            }
            pBVar3 = BIO_new_mem_buf(pem._M_dataplus._M_p,(int)pem._M_string_length);
            std::__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter> *)&bio,(pointer)pBVar3);
            gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__4.success_ =
                 (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
                 bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
                bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&gtest_ar__7);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&bad_pem,(internal *)&gtest_ar__4,(AssertionResult *)0x5104cb,"false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&infos2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc1b,bad_pem._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&infos2,(Message *)&gtest_ar__7);
              goto LAB_00358aa8;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__4.message_);
            gtest_ar__4._0_8_ =
                 infos._M_t.super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl;
            gtest_ar__7._0_8_ =
                 PEM_X509_INFO_read_bio
                           ((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                            (stack_st_X509_INFO *)
                            infos._M_t.
                            super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl,
                            (undefined1 *)0x0,(void *)0x0);
            testing::internal::CmpHelperEQ<stack_st_X509_INFO*,stack_st_X509_INFO*>
                      ((internal *)&bad_pem,"infos.get()",
                       "PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr)",
                       (stack_st_X509_INFO **)&gtest_ar__4,(stack_st_X509_INFO **)&gtest_ar__7);
            if ((char)bad_pem._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&gtest_ar__4);
              if (bad_pem._M_string_length == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)bad_pem._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc1d,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__4);
LAB_00358dfe:
              puVar5 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&bad_pem._M_string_length;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
              if (gtest_ar__4._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar__4._0_8_ + 8))();
              }
              goto LAB_00358e1f;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&bad_pem._M_string_length);
            gtest_ar__4.success_ = true;
            gtest_ar__4._1_7_ = 0;
            gtest_ar__7._0_8_ =
                 OPENSSL_sk_num((OPENSSL_STACK *)
                                infos._M_t.
                                super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl);
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&bad_pem,"2 * (sizeof(kExpected) / sizeof((kExpected)[0]))",
                       "sk_X509_INFO_num(infos.get())",(unsigned_long *)&gtest_ar__4,
                       (unsigned_long *)&gtest_ar__7);
            if ((char)bad_pem._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&gtest_ar__4);
              if (bad_pem._M_string_length == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)bad_pem._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc1e,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar__4);
              goto LAB_00358dfe;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&bad_pem._M_string_length);
            for (bad_pem._M_dataplus._M_p = (pointer)0x0; bad_pem._M_dataplus._M_p < &DAT_0000000f;
                bad_pem._M_dataplus._M_p = bad_pem._M_dataplus._M_p + 1) {
              testing::ScopedTrace::ScopedTrace<unsigned_long>
                        ((ScopedTrace *)&gtest_ar__4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc20,(unsigned_long *)&bad_pem);
              _Var1._M_p = bad_pem._M_dataplus._M_p;
              pEVar2 = (ExpectedInfo *)
                       OPENSSL_sk_value((OPENSSL_STACK *)
                                        infos._M_t.
                                        super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>.
                                        _M_head_impl,(size_t)bad_pem._M_dataplus._M_p);
              TestBody::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(&local_188._M_dataplus + (long)_Var1._M_p * 3),
                         pEVar2,info_00);
              _Var1 = bad_pem._M_dataplus;
              pEVar2 = (ExpectedInfo *)
                       OPENSSL_sk_value((OPENSSL_STACK *)
                                        infos._M_t.
                                        super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>.
                                        _M_head_impl,(size_t)(bad_pem._M_dataplus._M_p + 0xf));
              TestBody::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(&local_188._M_dataplus + (long)_Var1._M_p * 3),
                         pEVar2,info_01);
              testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&gtest_ar__4);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gtest_ar__4,&cert,&cert);
            std::operator+(&bad_pem,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&gtest_ar__4,&invalid);
            std::__cxx11::string::~string((string *)&gtest_ar__4);
            pBVar3 = BIO_new_mem_buf(bad_pem._M_dataplus._M_p,(int)bad_pem._M_string_length);
            std::__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter> *)&bio,(pointer)pBVar3);
            gtest_ar__7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__7.success_ =
                 (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
                 bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
                bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&infos2);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__4,(internal *)&gtest_ar__7,(AssertionResult *)0x5104cb
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_508,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc2b,(char *)gtest_ar__4._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_508,(Message *)&infos2);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_508);
              std::__cxx11::string::~string((string *)&gtest_ar__4);
              if ((__uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>)
                  infos2._M_t.super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)infos2._M_t.
                                      super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>.
                                      _M_head_impl + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__7.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__7.message_);
              infos2._M_t.super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl =
                   (__uniq_ptr_data<stack_st_X509_INFO,_bssl::internal::Deleter,_true,_true>)
                   PEM_X509_INFO_read_bio
                             ((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>
                                     ._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                              (stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
              gtest_ar__7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              bVar7 = (tuple<stack_st_X509_INFO_*,_bssl::internal::Deleter>)
                      infos2._M_t.super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>
                      ._M_t.super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl ==
                      (_Head_base<0UL,_stack_st_X509_INFO_*,_false>)0x0;
              gtest_ar__7.success_ = bVar7;
              if (!bVar7) {
                testing::Message::Message((Message *)&local_508);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__4,(internal *)&gtest_ar__7,
                           (AssertionResult *)"infos2","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_490,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xc2e,(char *)gtest_ar__4._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_490,(Message *)&local_508);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_490);
                std::__cxx11::string::~string((string *)&gtest_ar__4);
                if ((long *)local_508._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_508._M_dataplus._M_p + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__7.message_);
              pBVar3 = BIO_new_mem_buf(bad_pem._M_dataplus._M_p,(int)bad_pem._M_string_length);
              std::__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter> *)&bio,(pointer)pBVar3);
              puVar5 = &gtest_ar__7.message_;
              gtest_ar__7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__7.success_ =
                   (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
                   bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
                   (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
              if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
                  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
                  (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
                testing::Message::Message((Message *)&local_508);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__4,(internal *)&gtest_ar__7,
                           (AssertionResult *)0x5104cb,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_490,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xc31,(char *)gtest_ar__4._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_490,(Message *)&local_508);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_490);
                std::__cxx11::string::~string((string *)&gtest_ar__4);
                if ((long *)local_508._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_508._M_dataplus._M_p + 8))();
                }
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(puVar5);
                psVar4 = PEM_X509_INFO_read_bio
                                   ((BIO *)bio._M_t.
                                           super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                                    (stack_st_X509_INFO *)
                                    infos._M_t.
                                    super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>._M_head_impl
                                    ,(undefined1 *)0x0,(void *)0x0);
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__7.success_ = psVar4 == (stack_st_X509_INFO *)0x0;
                if (psVar4 != (stack_st_X509_INFO *)0x0) {
                  testing::Message::Message((Message *)&local_508);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__4,(internal *)&gtest_ar__7,
                             (AssertionResult *)
                             "PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr)",
                             "true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_490,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0xc33,(char *)gtest_ar__4._0_8_);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_490,(Message *)&local_508);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_490);
                  std::__cxx11::string::~string((string *)&gtest_ar__4);
                  if ((long *)local_508._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_508._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__7.message_);
                gtest_ar__7.success_ = true;
                gtest_ar__7._1_7_ = 0;
                local_508._M_dataplus._M_p =
                     (pointer)OPENSSL_sk_num((OPENSSL_STACK *)
                                             infos._M_t.
                                             super___uniq_ptr_impl<stack_st_X509_INFO,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_stack_st_X509_INFO_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_stack_st_X509_INFO_*,_false>.
                                             _M_head_impl);
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)&gtest_ar__4,
                           "2 * (sizeof(kExpected) / sizeof((kExpected)[0]))",
                           "sk_X509_INFO_num(infos.get())",(unsigned_long *)&gtest_ar__7,
                           (unsigned_long *)&local_508);
                if (gtest_ar__4.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__7);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar__4.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = *(char **)gtest_ar__4.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_508,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0xc34,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_508,(Message *)&gtest_ar__7);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_508);
                  if (gtest_ar__7._0_8_ != 0) {
                    (**(code **)(*(long *)gtest_ar__7._0_8_ + 8))();
                  }
                }
                puVar5 = &gtest_ar__4.message_;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(puVar5);
              std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::~unique_ptr(&infos2);
            }
            std::__cxx11::string::~string((string *)&bad_pem);
          }
          std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::~unique_ptr(&infos);
        }
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio);
        std::__cxx11::string::~string((string *)&pem);
        std::__cxx11::string::~string((string *)&encrypted_key);
        std::__cxx11::string::~string((string *)&invalid);
        std::__cxx11::string::~string((string *)&unknown);
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&placeholder_key);
    }
    std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr(&crl_obj);
    std::__cxx11::string::~string((string *)&crl);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&rsa_obj);
  std::__cxx11::string::~string((string *)&rsa);
LAB_00358eb3:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert_obj);
  std::__cxx11::string::~string((string *)&cert);
  return;
}

Assistant:

TEST(X509Test, PEMX509Info) {
  std::string cert = kRootCAPEM;
  auto cert_obj = CertFromPEM(kRootCAPEM);
  ASSERT_TRUE(cert_obj);

  std::string rsa = kRSAKey;
  auto rsa_obj = PrivateKeyFromPEM(kRSAKey);
  ASSERT_TRUE(rsa_obj);

  std::string crl = kBasicCRL;
  auto crl_obj = CRLFromPEM(kBasicCRL);
  ASSERT_TRUE(crl_obj);

  bssl::UniquePtr<EVP_PKEY> placeholder_key(EVP_PKEY_new());
  ASSERT_TRUE(placeholder_key);

  std::string unknown =
      "-----BEGIN UNKNOWN-----\n"
      "AAAA\n"
      "-----END UNKNOWN-----\n";

  std::string invalid =
      "-----BEGIN CERTIFICATE-----\n"
      "AAAA\n"
      "-----END CERTIFICATE-----\n";

  std::string encrypted_key = R"(-----BEGIN EC PRIVATE KEY-----
Proc-Type: 4,ENCRYPTED
DEK-Info: AES-128-CBC,B3B2988AECAE6EAB0D043105994C1123

RK7DUIGDHWTFh2rpTX+dR88hUyC1PyDlIULiNCkuWFwHrJbc1gM6hMVOKmU196XC
iITrIKmilFm9CPD6Tpfk/NhI/QPxyJlk1geIkxpvUZ2FCeMuYI1To14oYOUKv14q
wr6JtaX2G+pOmwcSPymZC4u2TncAP7KHgS8UGcMw8CE=
-----END EC PRIVATE KEY-----
)";

  // Each X509_INFO contains at most one certificate, CRL, etc. The format
  // creates a new X509_INFO when a repeated type is seen.
  std::string pem =
      // The first few entries have one of everything in different orders.
      cert + rsa + crl + rsa + crl + cert +
      // Unknown types are ignored.
      crl + unknown + cert + rsa +
      // Seeing a new certificate starts a new entry, so now we have a bunch of
      // certificate-only entries.
      cert + cert + cert +
      // The key folds into the certificate's entry.
      cert + rsa +
      // Doubled keys also start new entries.
      rsa + rsa + rsa + rsa + crl +
      // As do CRLs.
      crl + crl +
      // Encrypted private keys are not decrypted (decryption failures would be
      // fatal) and just returned as placeholder.
      crl + cert + encrypted_key +
      // Placeholder keys are still keys, so a new key starts a new entry.
      rsa;

  const struct ExpectedInfo {
    const X509 *cert;
    const EVP_PKEY *key;
    const X509_CRL *crl;
  } kExpected[] = {
      {cert_obj.get(), rsa_obj.get(), crl_obj.get()},
      {cert_obj.get(), rsa_obj.get(), crl_obj.get()},
      {cert_obj.get(), rsa_obj.get(), crl_obj.get()},
      {cert_obj.get(), nullptr, nullptr},
      {cert_obj.get(), nullptr, nullptr},
      {cert_obj.get(), nullptr, nullptr},
      {cert_obj.get(), rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), crl_obj.get()},
      {nullptr, nullptr, crl_obj.get()},
      {nullptr, nullptr, crl_obj.get()},
      {cert_obj.get(), placeholder_key.get(), crl_obj.get()},
      {nullptr, rsa_obj.get(), nullptr},
  };

  auto check_info = [](const ExpectedInfo *expected, const X509_INFO *info) {
    if (expected->cert != nullptr) {
      EXPECT_EQ(0, X509_cmp(expected->cert, info->x509));
    } else {
      EXPECT_EQ(nullptr, info->x509);
    }
    if (expected->crl != nullptr) {
      EXPECT_EQ(0, X509_CRL_cmp(expected->crl, info->crl));
    } else {
      EXPECT_EQ(nullptr, info->crl);
    }
    if (expected->key != nullptr) {
      ASSERT_NE(nullptr, info->x_pkey);
      if (EVP_PKEY_id(expected->key) == EVP_PKEY_NONE) {
        // Expect a placeholder key.
        EXPECT_FALSE(info->x_pkey->dec_pkey);
      } else {
        // EVP_PKEY_cmp returns one if the keys are equal.
        ASSERT_TRUE(info->x_pkey->dec_pkey);
        EXPECT_EQ(1, EVP_PKEY_cmp(expected->key, info->x_pkey->dec_pkey));
      }
    } else {
      EXPECT_EQ(nullptr, info->x_pkey);
    }
  };

  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(pem.data(), pem.size()));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<STACK_OF(X509_INFO)> infos(
      PEM_X509_INFO_read_bio(bio.get(), nullptr, nullptr, nullptr));
  ASSERT_TRUE(infos);
  ASSERT_EQ(OPENSSL_ARRAY_SIZE(kExpected), sk_X509_INFO_num(infos.get()));
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kExpected); i++) {
    SCOPED_TRACE(i);
    check_info(&kExpected[i], sk_X509_INFO_value(infos.get(), i));
  }

  // Passing an existing stack appends to it.
  bio.reset(BIO_new_mem_buf(pem.data(), pem.size()));
  ASSERT_TRUE(bio);
  ASSERT_EQ(infos.get(),
            PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr));
  ASSERT_EQ(2 * OPENSSL_ARRAY_SIZE(kExpected), sk_X509_INFO_num(infos.get()));
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kExpected); i++) {
    SCOPED_TRACE(i);
    check_info(&kExpected[i], sk_X509_INFO_value(infos.get(), i));
    check_info(
        &kExpected[i],
        sk_X509_INFO_value(infos.get(), i + OPENSSL_ARRAY_SIZE(kExpected)));
  }

  // Gracefully handle errors in both the append and fresh cases.
  std::string bad_pem = cert + cert + invalid;

  bio.reset(BIO_new_mem_buf(bad_pem.data(), bad_pem.size()));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<STACK_OF(X509_INFO)> infos2(
      PEM_X509_INFO_read_bio(bio.get(), nullptr, nullptr, nullptr));
  EXPECT_FALSE(infos2);

  bio.reset(BIO_new_mem_buf(bad_pem.data(), bad_pem.size()));
  ASSERT_TRUE(bio);
  EXPECT_FALSE(
      PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr));
  EXPECT_EQ(2 * OPENSSL_ARRAY_SIZE(kExpected), sk_X509_INFO_num(infos.get()));
}